

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  double dVar1;
  bool bVar2;
  reference pcVar3;
  reference pvVar4;
  bool local_1e9;
  bool local_1d1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1c8;
  const_iterator local_1c0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1b8;
  const_iterator local_1b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1a8 [2];
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_198;
  const_iterator local_190;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_188;
  const_iterator local_180;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_178;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_170;
  char *local_168;
  char *local_160;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_158;
  const_iterator local_150;
  size_type local_148;
  size_type size_1;
  char *local_138;
  char *local_130;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_128;
  const_iterator local_120;
  size_type local_118;
  size_type size;
  char *pcStack_108;
  int pipe;
  char *data;
  int length;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  const_iterator local_e8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e0;
  const_iterator local_d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  ulong local_c0;
  size_type length_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a8 [2];
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  const_iterator local_90;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_88;
  const_iterator local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  ulong local_68;
  size_type length_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  iterator erriter;
  iterator outiter;
  vector<char,_std::allocator<char>_> *err_local;
  vector<char,_std::allocator<char>_> *out_local;
  double timeout_local;
  string *line_local;
  cmsysProcess *process_local;
  
  out_local = (vector<char,_std::allocator<char>_> *)timeout;
  timeout_local = (double)line;
  line_local = (string *)process;
  std::__cxx11::string::operator=((string *)line,"");
  erriter = std::vector<char,_std::allocator<char>_>::begin(out);
  local_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
LAB_0068bf7c:
  local_50._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
  bVar2 = __gnu_cxx::operator!=(&erriter,&local_50);
  if (bVar2) {
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&erriter);
    local_1d1 = false;
    if (*pcVar3 == '\r') {
      local_58 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&erriter,1);
      length_1 = (size_type)std::vector<char,_std::allocator<char>_>::end(out);
      local_1d1 = __gnu_cxx::operator==
                            (&local_58,
                             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *
                             )&length_1);
    }
    if (local_1d1 == false) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&erriter);
      if ((*pcVar3 == '\n') ||
         (pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&erriter), *pcVar3 == '\0')) {
        local_70._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        local_68 = __gnu_cxx::operator-(&erriter,&local_70);
        bVar2 = false;
        if (1 < local_68) {
          local_78 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator-(&erriter,1);
          pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_78);
          bVar2 = *pcVar3 == '\r';
        }
        dVar1 = timeout_local;
        if (bVar2) {
          local_68 = local_68 - 1;
        }
        if (local_68 != 0) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
          std::__cxx11::string::append((char *)dVar1,(ulong)pvVar4);
        }
        local_88._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_80,&local_88);
        local_98 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&erriter,1);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_90,&local_98);
        std::vector<char,_std::allocator<char>_>::erase(out,local_80,local_90);
        return 2;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&erriter);
      goto LAB_0068bf7c;
    }
  }
  while( true ) {
    local_a8[0]._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
    bVar2 = __gnu_cxx::operator!=(&local_48,local_a8);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_48);
    local_1e9 = false;
    if (*pcVar3 == '\r') {
      local_b0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&local_48,1);
      length_2 = (size_type)std::vector<char,_std::allocator<char>_>::end(err);
      local_1e9 = __gnu_cxx::operator==
                            (&local_b0,
                             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *
                             )&length_2);
    }
    if (local_1e9 != false) break;
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_48);
    if ((*pcVar3 == '\n') ||
       (pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_48), *pcVar3 == '\0')) {
      local_c8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
      local_c0 = __gnu_cxx::operator-(&local_48,&local_c8);
      bVar2 = false;
      if (1 < local_c0) {
        local_d0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator-(&local_48,1);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_d0);
        bVar2 = *pcVar3 == '\r';
      }
      dVar1 = timeout_local;
      if (bVar2) {
        local_c0 = local_c0 - 1;
      }
      if (local_c0 != 0) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
        std::__cxx11::string::append((char *)dVar1,(ulong)pvVar4);
      }
      local_e0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_d8,
                 &local_e0);
      local_f0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&local_48,1);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_e8,
                 &local_f0);
      std::vector<char,_std::allocator<char>_>::erase(err,local_d8,local_e8);
      return 3;
    }
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&local_48);
  }
  size._4_4_ = cmsysProcess_WaitForData
                         ((cmsysProcess *)line_local,&stack0xfffffffffffffef8,
                          (int *)((long)&data + 4),(double *)&out_local);
  if (size._4_4_ == 0xff) {
    return 0xff;
  }
  if (size._4_4_ == 2) {
    local_118 = std::vector<char,_std::allocator<char>_>::size(out);
    local_128._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_120,
               &local_128);
    local_130 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                  ((vector<char,std::allocator<char>> *)out,local_120,pcStack_108,
                                   pcStack_108 + data._4_4_);
    size_1 = (size_type)std::vector<char,_std::allocator<char>_>::begin(out);
    local_138 = (char *)__gnu_cxx::
                        __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                        operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   *)&size_1,local_118);
    erriter._M_current = local_138;
  }
  else if (size._4_4_ == 3) {
    local_148 = std::vector<char,_std::allocator<char>_>::size(err);
    local_158._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_150,
               &local_158);
    local_160 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                  ((vector<char,std::allocator<char>> *)err,local_150,pcStack_108,
                                   pcStack_108 + data._4_4_);
    local_170._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
    local_168 = (char *)__gnu_cxx::
                        __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                        operator+(&local_170,local_148);
    local_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_168;
  }
  else if (size._4_4_ == 0) {
    bVar2 = std::vector<char,_std::allocator<char>_>::empty(out);
    dVar1 = timeout_local;
    if (bVar2) {
      bVar2 = std::vector<char,_std::allocator<char>_>::empty(err);
      dVar1 = timeout_local;
      if (bVar2) {
        process_local._4_4_ = 0;
      }
      else {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
        local_1a8[0]._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::operator-(&local_48,local_1a8);
        std::__cxx11::string::append((char *)dVar1,(ulong)pvVar4);
        local_1b8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_1b0,&local_1b8);
        local_1c8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_1c0,&local_1c8);
        std::vector<char,_std::allocator<char>_>::erase(err,local_1b0,local_1c0);
        process_local._4_4_ = 3;
      }
    }
    else {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
      local_178._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
      __gnu_cxx::operator-(&erriter,&local_178);
      std::__cxx11::string::append((char *)dVar1,(ulong)pvVar4);
      local_188._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_180
                 ,&local_188);
      local_198._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_190
                 ,&local_198);
      std::vector<char,_std::allocator<char>_>::erase(out,local_180,local_190);
      process_local._4_4_ = 2;
    }
    return process_local._4_4_;
  }
  goto LAB_0068bf7c;
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout,
                               std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  while(1)
    {
    // Check for a newline in stdout.
    for(;outiter != out.end(); ++outiter)
      {
      if((*outiter == '\r') && ((outiter+1) == out.end()))
        {
        break;
        }
      else if(*outiter == '\n' || *outiter == '\0')
        {
        std::vector<char>::size_type length = outiter-out.begin();
        if(length > 1 && *(outiter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&out[0], length);
          }
        out.erase(out.begin(), outiter+1);
        return cmsysProcess_Pipe_STDOUT;
        }
      }

    // Check for a newline in stderr.
    for(;erriter != err.end(); ++erriter)
      {
      if((*erriter == '\r') && ((erriter+1) == err.end()))
        {
        break;
        }
      else if(*erriter == '\n' || *erriter == '\0')
        {
        std::vector<char>::size_type length = erriter-err.begin();
        if(length > 1 && *(erriter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&err[0], length);
          }
        err.erase(err.begin(), erriter+1);
        return cmsysProcess_Pipe_STDERR;
        }
      }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if(pipe == cmsysProcess_Pipe_Timeout)
      {
      // Timeout has been exceeded.
      return pipe;
      }
    else if(pipe == cmsysProcess_Pipe_STDOUT)
      {
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), data, data+length);
      outiter = out.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_STDERR)
      {
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), data, data+length);
      erriter = err.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_None)
      {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      if(!out.empty())
        {
        line.append(&out[0], outiter-out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
        }
      else if(!err.empty())
        {
        line.append(&err[0], erriter-err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
        }
      else
        {
        return cmsysProcess_Pipe_None;
        }
      }
    }
}